

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

tc_toktyp_t __thiscall
CTcTokenizer::xlat_string_to
          (CTcTokenizer *this,char *dstp,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,
          int force_embed_end)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  uint ch;
  wchar_t wVar4;
  tc_toktyp_t tVar5;
  int iVar6;
  wchar_t wVar7;
  int iVar8;
  wchar_t wVar9;
  tok_embed_level *ptVar10;
  size_t sVar11;
  byte *pbVar12;
  long lVar13;
  ulong uVar14;
  CTcTokenizer *pCVar15;
  utf8_ptr uVar16;
  byte *pbVar17;
  CTcTokenizer *this_00;
  utf8_ptr dst;
  utf8_ptr fmt;
  CTcToken ftok;
  int local_a4;
  utf8_ptr local_a0;
  tok_embed_ctx *local_98;
  CTcTokenizer *local_90;
  tc_toktyp_t local_88;
  uint local_84;
  CTcTokenizer *local_80;
  utf8_ptr local_78;
  CTcTokString *local_70;
  CTcToken *local_68;
  utf8_ptr local_60;
  CTcToken local_58;
  
  local_a0.p_ = dstp;
  local_98 = ec;
  local_90 = this;
  wVar4 = utf8_ptr::s_getch(p->p_);
  if (wVar4 == L'\"') {
    tVar5 = TOKT_DSTR;
  }
  else if (wVar4 == L'\'') {
    tVar5 = TOKT_SSTR;
  }
  else if (wVar4 == L'R') {
    tVar5 = TOKT_RESTR;
  }
  else {
    tVar5 = TOKT_INVALID;
    if ((local_98 != (tok_embed_ctx *)0x0) && (local_98->level != 0)) {
      tVar5 = local_98->s->endtok;
    }
  }
  tok->typ_ = tVar5;
  if (wVar4 == L'R') {
    bVar1 = *p->p_;
    pbVar17 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
    p->p_ = (char *)pbVar17;
    wVar4 = utf8_ptr::s_getch((char *)pbVar17);
  }
  local_a4 = 0;
  if (((wVar4 == L'\'') || (wVar4 == L'\"')) && (iVar6 = count_quotes(p,wVar4), 2 < iVar6)) {
    pbVar17 = (byte *)p->p_;
    uVar14 = (ulong)(((*pbVar17 >> 5 & 1) != 0) + 1 & (uint)(*pbVar17 >> 7) * 3);
    p->p_ = (char *)(pbVar17 + uVar14 + 1);
    bVar1 = pbVar17[uVar14 + 1];
    p->p_ = (char *)(pbVar17 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar14 + 2);
    local_a4 = 1;
  }
  pbVar17 = (byte *)p->p_;
  wVar7 = L'\0';
  uVar14 = (ulong)(((*pbVar17 >> 5 & 1) != 0) + 1 & (uint)(*pbVar17 >> 7) * 3);
  pbVar12 = pbVar17 + uVar14 + 1;
  p->p_ = (char *)pbVar12;
  if (force_embed_end == 0) {
    if ((wVar4 != L'>') || ((local_98->level != 0 && (wVar4 = L'>', local_98->s->parens != 0))))
    goto LAB_0021f7b8;
    local_a4 = 0;
    p->p_ = (char *)(pbVar12 +
                    (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) + 1);
    iVar6 = local_98->level;
    wVar7 = L'\0';
    if (iVar6 != 0) {
      wVar7 = local_98->s->qu;
      local_a4 = local_98->s->triple;
    }
  }
  else {
    pbVar17 = pbVar17 + uVar14;
    bVar1 = pbVar17[-(ulong)(~(uint)(*pbVar17 >> 6) & (uint)(*pbVar17 >> 7))];
    p->p_ = (char *)(pbVar17 + -(ulong)(~(uint)(*pbVar17 >> 6) & (uint)(*pbVar17 >> 7)) +
                    -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7)));
    if (local_98->level != 0) {
      wVar7 = local_98->s->qu;
    }
    tVar5 = TOKT_INVALID;
    local_a4 = 0;
    if (local_98->level != 0) {
      local_a4 = local_98->s->triple;
      tVar5 = local_98->s->endtok;
    }
    tok->typ_ = tVar5;
    iVar6 = local_98->level;
  }
  if (0 < iVar6) {
    local_98->level = iVar6 + -1;
  }
  iVar6 = local_98->level;
  wVar4 = wVar7;
  if ((long)iVar6 == 0) {
    ptVar10 = (tok_embed_level *)0x0;
  }
  else {
    if (9 < iVar6) goto LAB_0021f7b8;
    ptVar10 = local_98->stk + (long)iVar6 + -1;
  }
  local_98->s = ptVar10;
LAB_0021f7b8:
  local_70 = &local_90->unsplicebuf_;
  local_84 = (uint)(char)wVar4;
  local_80 = (CTcTokenizer *)dstp;
  local_68 = tok;
  do {
    pCVar15 = (CTcTokenizer *)p->p_;
    wVar7 = utf8_ptr::s_getch((char *)pCVar15);
    if (wVar7 == wVar4) {
      if (local_a4 == 0) {
        bVar1 = *p->p_;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
LAB_0021fa79:
        iVar8 = 2;
      }
      else {
        pCVar15 = (CTcTokenizer *)p;
        iVar6 = count_quotes(p,wVar4);
        iVar8 = 0;
        if (2 < iVar6) {
          uVar16.p_ = local_a0.p_;
          if (iVar6 != 3) {
            iVar8 = iVar6 + 1;
            do {
              pCVar15 = (CTcTokenizer *)uVar16.p_;
              sVar11 = utf8_ptr::s_putch(uVar16.p_,wVar4);
              uVar16.p_ = (char *)((long)&((CTcTokenizer *)uVar16.p_)->field_0x0 + sVar11);
              bVar1 = *p->p_;
              p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
              iVar8 = iVar8 + -1;
            } while (4 < iVar8);
          }
          pbVar17 = (byte *)p->p_;
          lVar13 = -3;
          do {
            pbVar17 = pbVar17 + (ulong)(((*pbVar17 >> 5 & 1) != 0) + 1 & (uint)(*pbVar17 >> 7) * 3)
                                + 1;
            p->p_ = (char *)pbVar17;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0);
          iVar8 = 2;
          dstp = (char *)local_80;
          tok = local_68;
          local_a0.p_ = uVar16.p_;
        }
        if (iVar6 < 3) goto LAB_0021f8ac;
      }
    }
    else {
LAB_0021f8ac:
      if (wVar7 == L'\\') {
        xlat_escape(pCVar15,&local_a0,p,wVar4,local_a4);
        iVar8 = 3;
      }
      else if (wVar7 == L'\0') {
        sVar11 = (long)local_a0.p_ - (long)dstp;
        tok->text_ = dstp;
        tok->text_len_ = sVar11;
        *local_a0.p_ = 0;
        if (0 < (long)sVar11) {
          uVar14 = 0;
          pCVar15 = (CTcTokenizer *)dstp;
          do {
            pCVar15 = (CTcTokenizer *)
                      (&pCVar15->field_0x1 +
                      (((*(byte *)pCVar15 >> 5 & 1) != 0) + 1 & (uint)(*(byte *)pCVar15 >> 7) * 3));
            uVar14 = uVar14 + 1;
          } while (pCVar15 < local_a0.p_);
          if (0x14 < uVar14) {
            lVar13 = -0x14;
            pCVar15 = (CTcTokenizer *)dstp;
            do {
              pCVar15 = (CTcTokenizer *)
                        (&pCVar15->field_0x1 +
                        (((*(byte *)pCVar15 >> 5 & 1) != 0) + 1 & (uint)(*(byte *)pCVar15 >> 7) * 3)
                        );
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
            sVar11 = (long)pCVar15 - (long)dstp;
          }
        }
        if (((wVar4 == L'\"') && (tok->text_len_ == 0)) &&
           (sVar2 = (local_90->unsplicebuf_).buf_len_, sVar2 != 0)) {
          local_a0.p_ = (char *)(local_a0.p_ + 1);
          CTcTokString::ensure_space(local_70,sVar2 + 2);
          pCVar15 = local_90;
          pcVar3 = (local_90->unsplicebuf_).buf_;
          memmove(pcVar3 + 1,pcVar3,(local_90->unsplicebuf_).buf_len_);
          uVar14 = (pCVar15->unsplicebuf_).buf_len_ + 1;
          (pCVar15->unsplicebuf_).buf_len_ = uVar14;
          if (uVar14 < (pCVar15->unsplicebuf_).buf_size_) {
            (local_90->unsplicebuf_).buf_[uVar14] = '\0';
          }
          *pcVar3 = '\"';
          iVar8 = 1;
          local_88 = TOKT_NULLTOK;
        }
        else {
          local_a0.p_ = local_a0.p_ + 1;
          log_error(0x2b11,(ulong)local_84,sVar11,dstp,(ulong)local_84);
          local_88 = tok->typ_;
          iVar8 = 1;
        }
      }
      else {
        if (((local_98 != (tok_embed_ctx *)0x0) && (wVar7 == L'<')) &&
           ((tok->typ_ != TOKT_RESTR && (wVar9 = utf8_ptr::s_getch_at(p->p_,1), wVar9 == L'<')))) {
          tVar5 = tok->typ_;
          if (tVar5 == TOKT_SSTR) {
            tVar5 = TOKT_SSTR_START;
          }
          else if (tVar5 == TOKT_DSTR) {
            tVar5 = TOKT_DSTR_START;
          }
          else if (tVar5 == TOKT_DSTR_END) {
            tVar5 = TOKT_DSTR_MID;
          }
          else if (tVar5 == TOKT_SSTR_END) {
            tVar5 = TOKT_SSTR_MID;
          }
          tok->typ_ = tVar5;
          pbVar17 = (byte *)p->p_;
          lVar13 = -2;
          do {
            pbVar17 = pbVar17 + (ulong)(((*pbVar17 >> 5 & 1) != 0) + 1 & (uint)(*pbVar17 >> 7) * 3)
                                + 1;
            p->p_ = (char *)pbVar17;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0);
          wVar7 = utf8_ptr::s_getch((char *)pbVar17);
          pCVar15 = local_90;
          if (wVar7 == L'%') {
            pcVar3 = p->p_;
            this_00 = local_90;
            local_60.p_ = pcVar3;
            scan_sprintf_spec(local_90,p);
            local_78.p_ = pcVar3;
            xlat_escapes(this_00,&local_78,&local_60,p);
            dstp = (char *)local_80;
            local_58.text_len_ = (long)local_78.p_ - (long)pcVar3;
            local_58.typ_ = TOKT_FMTSPEC;
            local_58.text_ = pcVar3;
            push(pCVar15,&local_58);
          }
          tok_embed_ctx::start_expr(local_98,wVar4,local_a4,1);
          goto LAB_0021fa79;
        }
        uVar16.p_ = local_a0.p_;
        sVar11 = utf8_ptr::s_putch(local_a0.p_,wVar7);
        local_a0.p_ = uVar16.p_ + sVar11;
        bVar1 = *p->p_;
        iVar8 = 0;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      }
    }
    if ((iVar8 != 0) && (iVar8 != 3)) {
      if (iVar8 == 2) {
        tok->text_ = dstp;
        tok->text_len_ = (long)local_a0.p_ - (long)dstp;
        *local_a0.p_ = 0;
        local_88 = tok->typ_;
      }
      return local_88;
    }
  } while( true );
}

Assistant:

tc_toktyp_t CTcTokenizer::xlat_string_to(
    char *dstp, utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec,
    int force_embed_end)
{
    /* set up our output utf8 pointer */
    utf8_ptr dst(dstp);

    /* note the open quote character */
    wchar_t qu = p->getch();

    /* set the appropriate string token type */
    tok->settyp(qu == '"' ? TOKT_DSTR :
                qu == '\'' ? TOKT_SSTR :
                qu == 'R' ? TOKT_RESTR :
                ec != 0 ? ec->endtok() :
                TOKT_INVALID);

    /* if it's a regex string, skip the 'R' and note the actual quote type */
    if (qu == 'R')
    {
        p->inc();
        qu = p->getch();
    }

    /* 
     *   If we're at a quote (rather than at '>>' for continuing from an
     *   embedded expression), count consecutive open quotes, to determine if
     *   we're in a triple-quoted string.  
     */
    int triple = FALSE;
    if (qu == '"' || qu == '\'')
    {
        /* count the consecutive open quotes */
        if (count_quotes(p, qu) >= 3)
        {
            /* skip past the additional two open quotes */
            p->inc();
            p->inc();

            /* note that we're in a triple-quoted string */
            triple = TRUE;
        }
    }

    /* skip the open quote */
    p->inc();

    /* check for the end of an embedded expression (forced or actual) */
    if (force_embed_end)
    {
        /* 
         *   they want us to assume the embedding ends here, regardless of
         *   what we're looking at - act the same as though we had
         *   actually seen '>>', but don't skip any input (in fact, back
         *   up one, since we already skipped one character for what we
         *   had thought was the open quote 
         */
        p->dec();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();
        tok->settyp(ec->endtok());

        /* clear the caller's in-embedding status */
        ec->end_expr();
    }
    else if (qu == '>' && ec->parens() == 0)
    {
        /* skip the second '>' */
        p->inc();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();

        /* end the expression */
        ec->end_expr();
    }

    /* scan the string and translate quotes */
    for (;;)
    {
        /* get this character */
        wchar_t cur = p->getch();

        /* if this is the matching quote, we're done */
        if (cur == qu)
        {
            /* 
             *   If we're in a triple-quote string, count consecutive quotes.
             *   Triple quotes are greedy: if we have N>3 quotes in a row,
             *   the first N-3 are inside the string, and the last 3 are the
             *   terminating quotes. 
             */
            if (triple)
            {
                /* we need at least three quotes to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* copy all but the last three quotes to the output */
                    for ( ; qcnt > 3 ; --qcnt, p->inc())
                        dst.setch(qu);

                    /* skip the three quotes */
                    p->inc_by(3);

                    /* done with the string */
                    break;
                }
            }
            else
            {
                /* 
                 *   It's an ordinary string, which ends with just one
                 *   matching quote, so we're done no matter what follows.
                 *   Skip the quote and stop scanning.
                 */
                p->inc();
                break;
            }
        }

        /* 
         *   if we find an end-of-line within the string, it's an error -
         *   we should always splice strings together onto a single line
         *   before starting to tokenize the line 
         */
        if (cur == '\0')
        {
            /* set the token's text pointer */
            size_t bytelen = dst.getptr() - dstp;
            tok->set_text(dstp, bytelen);

            /* null-terminate the result string */
            dst.setch('\0');

            /* 
             *   get the length of the unterminated string so far, but for
             *   error logging, limit the length to twenty characters --
             *   we just want to give the user enough information to find
             *   the string in error, without making the error message
             *   huge 
             */
            utf8_ptr dp(dstp);
            size_t charlen = dp.len(bytelen);
            if (charlen > 20)
                bytelen = dp.bytelen(20);

            /*
             *   Check for a special heuristic case.  If the string was of
             *   zero length, and we have something sitting in our
             *   unsplice buffer, here's what probably happened: the input
             *   was missing a ">>" sequence at the end of an embedded
             *   expression, and the parser told us to put it back in.  We
             *   had earlier decided we needed to splice up to a quote to
             *   end what looked to us like an unterminated string.  If
             *   this is the case, we and the parser are working at cross
             *   purposes; the parser is smarter than we are, so we should
             *   synchronize with it.  
             */
            if (tok->get_text_len() == 0
                && qu == '"'
                && unsplicebuf_.get_text_len() != 0)
            {
                /* 
                 *   we must have spliced a line to finish a string -
                 *   insert the quote into the splice buffer, and ignore
                 *   it here 
                 */

                /* 
                 *   make sure there's room for one more character (plus a
                 *   null byte) 
                 */
                unsplicebuf_.ensure_space(unsplicebuf_.get_text_len() + 2);

                /* get the buffer pointer */
                char *buf = unsplicebuf_.get_buf();

                /* make room for the '"' */
                memmove(buf + 1, buf, unsplicebuf_.get_text_len());
                unsplicebuf_.set_text_len(unsplicebuf_.get_text_len() + 1);

                /* add the '"' */
                *buf = '"';

                /* 
                 *   return the 'null token' to tell the caller to try
                 *   again - do not log an error at this point 
                 */
                return TOKT_NULLTOK;
            }

            /* log the error */
            log_error(TCERR_UNTERM_STRING,
                      (char)qu, (int)bytelen, dstp, (char)qu);

            /* return the string type */
            return tok->gettyp();
        }

        /* if this is an escape, translate it */
        if (cur == '\\')
        {
            /* translate the escape */
            xlat_escape(&dst, p, qu, triple);
            continue;
        }
        else if (ec != 0
                 && tok->gettyp() != TOKT_RESTR
                 && cur == '<' && p->getch_at(1) == '<')
        {
            /* 
             *   It's the start of an embedded expression - change the type
             *   to so indicate.  If we think we have a regular SSTR or DSTR,
             *   switch to the appropriate START type, since the part up to
             *   here is actually the starting fragment of a string with an
             *   embedded expression.  If we think we're in an END section,
             *   switch to the corresponding MID section, since we're parsing
             *   a fragment that already followed an embedding.  The only
             *   other possibility is that we're in a MID section, in which
             *   case just stay in the same MID section.  
             */
            tc_toktyp_t tt = tok->gettyp();
            tok->settyp(tt == TOKT_DSTR ? TOKT_DSTR_START :
                        tt == TOKT_DSTR_END ? TOKT_DSTR_MID :
                        tt == TOKT_SSTR ? TOKT_SSTR_START :
                        tt == TOKT_SSTR_END ? TOKT_SSTR_MID :
                        tt);

            /* skip the << */
            p->inc_by(2);

            /*
             *   Check for a '%' sprintf-style formatting sequence.  If we
             *   have a '%' immediately after the second '<', it's a sprintf
             *   format code. 
             */
            if (p->getch() == '%')
            {
                /* remember the starting point of the format string */
                utf8_ptr fmt(p);

                /* scan the format spec */
                scan_sprintf_spec(p);

                /* translate escapes */
                utf8_ptr dst(&fmt);
                xlat_escapes(&dst, &fmt, p);

                /* push the format spec into the token stream */
                CTcToken ftok;
                ftok.set_text(fmt.getptr(), dst.getptr() - fmt.getptr());
                ftok.settyp(TOKT_FMTSPEC);
                push(&ftok);
            }

            /* tell the caller we're in an embedding */
            ec->start_expr(qu, triple, TRUE);

            /* stop scanning */
            break;
        }

        /* copy this character to the output position */
        dst.setch(cur);

        /* get the next character */
        p->inc();
    }

    /* set the token's text pointer */
    tok->set_text(dstp, dst.getptr() - dstp);

    /* null-terminate the result string */
    dst.setch('\0');

    /* return the string type */
    return tok->gettyp();
}